

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O3

void __thiscall
InternalFixupSectionNames_SectionName_Test::~InternalFixupSectionNames_SectionName_Test
          (InternalFixupSectionNames_SectionName_Test *this)

{
  unique_ptr<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  *this_00;
  
  this_00 = &this[-1].super_InternalFixupSectionNames.super_InternalFixupMembersImport.super_Test.
             gtest_flag_saver_;
  this[-1].super_InternalFixupSectionNames.super_InternalFixupMembersImport.super_Test.
  gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)&PTR__InternalFixupMembersImport_002393c8;
  pstore::database::~database
            ((database *)
             &this[-1].super_InternalFixupSectionNames.super_InternalFixupMembersImport.db_.storage_
            );
  in_memory_store::~in_memory_store
            ((in_memory_store *)
             &this[-1].super_InternalFixupSectionNames.super_InternalFixupMembersImport.db_storage_.
              buffer_.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x158);
  return;
}

Assistant:

TEST_P (InternalFixupSectionNames, SectionName) {
    auto const & ns = GetParam ();
    std::ostringstream os;
    os << R"({ "section" : ")" << std::get<pstore::gsl::czstring> (ns)
       << R"(", "type":17, "offset":19, "addend":-23 })";

    internal_fixup_collection fixups;
    auto const & parser = this->parse (os.str (), &fixups);
    ASSERT_FALSE (parser.has_error ()) << "JSON error was: " << parser.last_error ().message ();

    ASSERT_EQ (fixups.size (), 1U);
    EXPECT_EQ (fixups[0].section, std::get<pstore::repo::section_kind> (ns));
    EXPECT_EQ (fixups[0].type, 17U);
    EXPECT_EQ (fixups[0].offset, 19U);
    EXPECT_EQ (fixups[0].addend, -23);
}